

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_Set_Charmap(FT_Face face,FT_CharMap charmap)

{
  FT_CharMap *ppFVar1;
  FT_Error FVar2;
  FT_Long FVar3;
  FT_CharMap *ppFVar4;
  
  if (face == (FT_Face)0x0) {
    return 0x23;
  }
  ppFVar4 = face->charmaps;
  FVar2 = 0x26;
  if (charmap != (FT_CharMap)0x0 && ppFVar4 != (FT_CharMap *)0x0) {
    FVar3 = FT_Get_CMap_Format(charmap);
    FVar2 = 6;
    if ((FVar3 != 0xe) && (0 < (long)face->num_charmaps)) {
      ppFVar1 = ppFVar4 + face->num_charmaps;
      do {
        if (*ppFVar4 == charmap) {
          face->charmap = *ppFVar4;
          return 0;
        }
        ppFVar4 = ppFVar4 + 1;
      } while (ppFVar4 < ppFVar1);
    }
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Set_Charmap( FT_Face     face,
                  FT_CharMap  charmap )
  {
    FT_CharMap*  cur;
    FT_CharMap*  limit;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    cur = face->charmaps;
    if ( !cur || !charmap )
      return FT_THROW( Invalid_CharMap_Handle );

    if ( FT_Get_CMap_Format( charmap ) == 14 )
      return FT_THROW( Invalid_Argument );

    limit = cur + face->num_charmaps;

    for ( ; cur < limit; cur++ )
    {
      if ( cur[0] == charmap )
      {
        face->charmap = cur[0];
        return FT_Err_Ok;
      }
    }

    return FT_THROW( Invalid_Argument );
  }